

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall DMessageBoxMenu::HandleResult(DMessageBoxMenu *this,bool res)

{
  DMenu *pDVar1;
  undefined8 in_RAX;
  DMessageBoxMenu *this_00;
  undefined1 auStack_18 [8];
  
  pDVar1 = (this->super_DMenu).mParentMenu.field_0.p;
  if (pDVar1 != (DMenu *)0x0) {
    if (((pDVar1->super_DObject).ObjectFlags & 0x20) == 0) {
      if (this->mMessageMode == 0) {
        auStack_18 = (undefined1  [8])in_RAX;
        if ((this->mAction).Index == 0) {
          (*(pDVar1->super_DObject)._vptr_DObject[8])(pDVar1,(ulong)(res ^ 0xd),0);
          (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
          this_00 = this;
        }
        else {
          this_00 = this;
          (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
          if (res) {
            this_00 = (DMessageBoxMenu *)(auStack_18 + 4);
            auStack_18._4_4_ = (this->mAction).Index;
            M_SetMenu((FName *)this_00,-1);
          }
        }
        CloseSound(this_00);
      }
    }
    else {
      (this->super_DMenu).mParentMenu.field_0.p = (DMenu *)0x0;
    }
  }
  return;
}

Assistant:

void DMessageBoxMenu::HandleResult(bool res)
{
	if (mParentMenu != NULL)
	{
		if (mMessageMode == 0)
		{
			if (mAction == NAME_None) 
			{
				mParentMenu->MenuEvent(res? MKEY_MBYes : MKEY_MBNo, false);
				Close();
			}
			else 
			{
				Close();
				if (res) M_SetMenu(mAction, -1);
			}
			CloseSound();
		}
	}
}